

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

Am_Wrapper * Am_Compute_MG_Feedback_Object_proc(Am_Object *self)

{
  ushort uVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Object *prev;
  Am_Wrapper *pAVar4;
  bool local_6a;
  Am_Object local_50;
  Am_Object local_48;
  byte local_39;
  Am_Object local_38;
  byte local_2d;
  bool as_line;
  Am_Object local_20;
  Am_Object owner;
  Am_Object feedback;
  Am_Object *self_local;
  
  Am_Object::Am_Object(&owner);
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  pAVar3 = Am_Object::Get(self,0xdb,0);
  local_2d = Am_Value::operator_cast_to_bool(pAVar3);
  pAVar3 = Am_Object::Get(&local_20,local_2d ^ 0x1df,0);
  Am_Object::operator=(&owner,pAVar3);
  local_39 = 0;
  bVar2 = Am_Object::Valid(&owner);
  local_6a = false;
  if (bVar2) {
    Am_Object::Get_Object(&local_38,(Am_Slot_Key)&owner,0x193);
    local_39 = 1;
    local_6a = Am_Object::operator!=(&local_38,&local_20);
  }
  if ((local_39 & 1) != 0) {
    Am_Object::~Am_Object(&local_38);
  }
  if (local_6a != false) {
    Am_Object::Create(&local_48,(char *)&owner);
    prev = Am_Object::Set(&local_48,0x69,false,0);
    Am_Object::operator=(&owner,prev);
    Am_Object::~Am_Object(&local_48);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_20);
    Am_Object::Set(&owner,0x193,pAVar4,0);
    uVar1 = (ushort)local_2d;
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&owner);
    Am_Object::Set(&local_20,uVar1 & 1 ^ 0x1df,pAVar4,0);
    Am_Object::Am_Object(&local_50,&owner);
    Am_Object::Add_Part(&local_20,&local_50,false,0);
    Am_Object::~Am_Object(&local_50);
  }
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&owner);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&owner);
  return pAVar4;
}

Assistant:

Am_Define_Object_Formula(Am_Compute_MG_Feedback_Object)
{
  Am_Object feedback;
  Am_Object owner = self.Get_Owner();
  bool as_line = self.Get(Am_AS_LINE);
  feedback =
      owner.Get(as_line ? Am_LINE_FEEDBACK_OBJECT : Am_RECT_FEEDBACK_OBJECT);
  if (feedback.Valid() &&
      feedback.Get_Object(Am_OPERATES_ON, Am_NO_DEPENDENCY) != owner) {
    feedback = feedback.Create().Set(Am_VISIBLE, false);
    feedback.Set(Am_OPERATES_ON, owner);
    owner.Set(as_line ? Am_LINE_FEEDBACK_OBJECT : Am_RECT_FEEDBACK_OBJECT,
              feedback);
    owner.Add_Part(feedback, false);
  }
  return feedback;
}